

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O0

void __thiscall indk::NeuralNet::doInterlinkInit(NeuralNet *this,int port,int timeout)

{
  bool bVar1;
  byte bVar2;
  Interlink *this_00;
  string local_b8;
  string local_98;
  anon_class_8_1_8991fb9c local_78;
  ProfilerCallback local_70;
  anon_class_8_1_8991fb9c local_50;
  ProfilerCallback local_48;
  int local_18;
  int local_14;
  int timeout_local;
  int port_local;
  NeuralNet *this_local;
  
  local_18 = timeout;
  local_14 = port;
  _timeout_local = this;
  this_00 = (Interlink *)operator_new(0xa0);
  Interlink::Interlink(this_00,local_14,local_18);
  this->InterlinkService = this_00;
  local_50.this = this;
  std::function<void(indk::NeuralNet*)>::
  function<indk::NeuralNet::doInterlinkInit(int,int)::__0,void>
            ((function<void(indk::NeuralNet*)> *)&local_48,&local_50);
  Profiler::doAttachCallback(this,1,&local_48);
  std::function<void_(indk::NeuralNet_*)>::~function(&local_48);
  local_78.this = this;
  std::function<void(indk::NeuralNet*)>::
  function<indk::NeuralNet::doInterlinkInit(int,int)::__1,void>
            ((function<void(indk::NeuralNet*)> *)&local_70,&local_78);
  Profiler::doAttachCallback(this,0,&local_70);
  std::function<void_(indk::NeuralNet_*)>::~function(&local_70);
  bVar1 = Interlink::isInterlinked(this->InterlinkService);
  if (bVar1) {
    Interlink::getStructure_abi_cxx11_(&local_98,this->InterlinkService);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_98);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      Interlink::getStructure_abi_cxx11_(&local_b8,this->InterlinkService);
      setStructure(this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  return;
}

Assistant:

void indk::NeuralNet::doInterlinkInit(int port, int timeout) {
    InterlinkService = new indk::Interlink(port, timeout);

    indk::Profiler::doAttachCallback(this, indk::Profiler::EventFlags::EventTick, [this](indk::NeuralNet *nn) {
        auto neurons = getNeurons();
        for (uint64_t i = 0; i < neurons.size(); i++) {
            if (i >= InterlinkDataBuffer.size()) {
                InterlinkDataBuffer.emplace_back();
            }
            InterlinkDataBuffer[i].push_back(std::to_string(neurons[i]->doSignalReceive().second));
        }
    });

    indk::Profiler::doAttachCallback(this, indk::Profiler::EventFlags::EventProcessed, [this](indk::NeuralNet *nn) {
        doInterlinkSyncData();
    });

    if (InterlinkService->isInterlinked()) {
        if (!InterlinkService->getStructure().empty()) setStructure(InterlinkService->getStructure());
    }
}